

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::RandomBernoulliDynamicLayerParams::~RandomBernoulliDynamicLayerParams
          (RandomBernoulliDynamicLayerParams *this)

{
  ~RandomBernoulliDynamicLayerParams(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

RandomBernoulliDynamicLayerParams::~RandomBernoulliDynamicLayerParams() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.RandomBernoulliDynamicLayerParams)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}